

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O1

void __thiscall QPDFJob::doJSONAcroform(QPDFJob *this,Pipeline *p,bool *first,QPDF *pdf)

{
  element_type *peVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  element_type *utf8;
  pointer this_00;
  JSON j_choices;
  JSON j_field;
  QPDFFormFieldObjectHelper ffh;
  JSON j_annot;
  JSON j_acroform;
  JSON j_fields;
  QPDFAcroFormDocumentHelper afdh;
  undefined1 local_368 [32];
  string local_348;
  undefined1 local_328 [24];
  element_type *local_310;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_308;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2f8;
  undefined1 local_2f0 [56];
  undefined1 local_2b8 [32];
  long local_298;
  undefined **local_290;
  Pipeline *local_288;
  bool *local_280;
  pointer local_278;
  pointer local_270;
  QPDFAnnotationObjectHelper *local_268;
  JSON local_260;
  QPDFAcroFormDocumentHelper local_250;
  vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_> local_230;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> local_218;
  QPDFAnnotationObjectHelper local_200;
  QPDFPageObjectHelper local_1c8;
  JSON local_190;
  JSON local_180;
  JSON local_170;
  JSON local_160;
  JSON local_150;
  JSON local_140;
  JSON local_130;
  JSON local_120;
  JSON local_110;
  JSON local_100;
  JSON local_f0;
  JSON local_e0;
  JSON local_d0;
  JSON local_c0;
  JSON local_b0;
  JSON local_a0;
  JSON local_90;
  JSON local_80;
  JSON local_70;
  JSON local_60;
  JSON local_50;
  JSON local_40;
  
  local_2f8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  JSON::makeDictionary();
  QPDFAcroFormDocumentHelper::QPDFAcroFormDocumentHelper(&local_250,pdf);
  peVar1 = (element_type *)(local_2f0 + 0x10);
  local_2f0._0_8_ = peVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2f0,"hasacroform","");
  bVar3 = QPDFAcroFormDocumentHelper::hasAcroForm(&local_250);
  JSON::makeBool((JSON *)local_368,bVar3);
  JSON::addDictionaryMember(&local_40,(string *)(local_2b8 + 0x10),(JSON *)local_2f0);
  if (local_40.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if ((string *)local_368._8_8_ != (string *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_368._8_8_);
  }
  if ((element_type *)local_2f0._0_8_ != peVar1) {
    operator_delete((void *)local_2f0._0_8_,(ulong)(local_2f0._16_8_ + 1));
  }
  local_2f0._0_8_ = peVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2f0,"needappearances","");
  bVar3 = QPDFAcroFormDocumentHelper::getNeedAppearances(&local_250);
  JSON::makeBool((JSON *)local_368,bVar3);
  JSON::addDictionaryMember(&local_50,(string *)(local_2b8 + 0x10),(JSON *)local_2f0);
  if (local_50.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if ((string *)local_368._8_8_ != (string *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_368._8_8_);
  }
  if ((element_type *)local_2f0._0_8_ != peVar1) {
    operator_delete((void *)local_2f0._0_8_,(ulong)(local_2f0._16_8_ + 1));
  }
  local_2f0._0_8_ = peVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2f0,"fields","");
  JSON::makeArray();
  JSON::addDictionaryMember(&local_260,(string *)(local_2b8 + 0x10),(JSON *)local_2f0);
  if ((string *)local_368._8_8_ != (string *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_368._8_8_);
  }
  if ((element_type *)local_2f0._0_8_ != peVar1) {
    operator_delete((void *)local_2f0._0_8_,(ulong)(local_2f0._16_8_ + 1));
  }
  local_288 = p;
  local_280 = first;
  QPDFPageDocumentHelper::QPDFPageDocumentHelper((QPDFPageDocumentHelper *)local_2f0,pdf);
  QPDFPageDocumentHelper::getAllPages(&local_218,(QPDFPageDocumentHelper *)local_2f0);
  QPDFPageDocumentHelper::~QPDFPageDocumentHelper((QPDFPageDocumentHelper *)local_2f0);
  local_278 = local_218.
              super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  if (local_218.super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_218.super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    local_298 = 0;
    local_290 = &PTR__QPDFObjectHelper_002f1ce8;
    do {
      local_1c8.super_QPDFObjectHelper.super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           ((local_218.
             super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>._M_impl
             .super__Vector_impl_data._M_start)->super_QPDFObjectHelper).super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_1c8.super_QPDFObjectHelper.super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           ((local_218.
             super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>._M_impl
             .super__Vector_impl_data._M_start)->super_QPDFObjectHelper).super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if (local_1c8.super_QPDFObjectHelper.super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_1c8.super_QPDFObjectHelper.super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_1c8.super_QPDFObjectHelper.super_BaseHandle.obj.
                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_1c8.super_QPDFObjectHelper.super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_1c8.super_QPDFObjectHelper.super_BaseHandle.obj.
                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi)->_M_use_count + 1;
        }
      }
      local_1c8.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           ((local_218.
             super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>._M_impl
             .super__Vector_impl_data._M_start)->super_QPDFObjectHelper).oh_.super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_1c8.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           ((local_218.
             super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>._M_impl
             .super__Vector_impl_data._M_start)->super_QPDFObjectHelper).oh_.super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if (local_1c8.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_1c8.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_1c8.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_1c8.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_1c8.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi)->_M_use_count + 1;
        }
      }
      local_1c8.super_QPDFObjectHelper._vptr_QPDFObjectHelper =
           (_func_int **)&PTR__QPDFPageObjectHelper_002ef088;
      local_1c8.m.super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = ((local_218.
                 super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>.
                 _M_impl.super__Vector_impl_data._M_start)->m).
               super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_1c8.m.super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           ((local_218.
             super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>._M_impl
             .super__Vector_impl_data._M_start)->m).
           super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
      if (local_1c8.m.super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_1c8.m.super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count =
               (local_1c8.m.
                super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_1c8.m.super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count =
               (local_1c8.m.
                super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      local_270 = local_218.
                  super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      QPDFAcroFormDocumentHelper::getWidgetAnnotationsForPage(&local_230,&local_250,&local_1c8);
      local_298 = local_298 + 1;
      QPDFPageObjectHelper::~QPDFPageObjectHelper(&local_1c8);
      local_268 = local_230.
                  super__Vector_base<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      this_00 = local_230.
                super__Vector_base<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (local_230.
          super__Vector_base<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_230.
          super__Vector_base<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        do {
          local_200.super_QPDFObjectHelper.super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (this_00->super_QPDFObjectHelper).super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_200.super_QPDFObjectHelper.super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (this_00->super_QPDFObjectHelper).super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
          if (local_200.super_QPDFObjectHelper.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_200.super_QPDFObjectHelper.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_use_count = (local_200.super_QPDFObjectHelper.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                             ._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_200.super_QPDFObjectHelper.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_use_count = (local_200.super_QPDFObjectHelper.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                             ._M_pi)->_M_use_count + 1;
            }
          }
          local_200.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (this_00->super_QPDFObjectHelper).oh_.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_200.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (this_00->super_QPDFObjectHelper).oh_.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
          if (local_200.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_200.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_use_count = (local_200.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                             ._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_200.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_use_count = (local_200.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                             ._M_pi)->_M_use_count + 1;
            }
          }
          local_200.super_QPDFObjectHelper._vptr_QPDFObjectHelper =
               (_func_int **)&PTR__QPDFAnnotationObjectHelper_002ef050;
          local_200.m.
          super___shared_ptr<QPDFAnnotationObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               = (this_00->m).
                 super___shared_ptr<QPDFAnnotationObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
          local_200.m.
          super___shared_ptr<QPDFAnnotationObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi =
               (this_00->m).
               super___shared_ptr<QPDFAnnotationObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
          if (local_200.m.
              super___shared_ptr<QPDFAnnotationObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_200.m.
               super___shared_ptr<QPDFAnnotationObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_200.m.
                    super___shared_ptr<QPDFAnnotationObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_200.m.
               super___shared_ptr<QPDFAnnotationObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_200.m.
                    super___shared_ptr<QPDFAnnotationObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          QPDFAcroFormDocumentHelper::getFieldForAnnotation
                    ((QPDFFormFieldObjectHelper *)local_2f0,&local_250,&local_200);
          QPDFAnnotationObjectHelper::~QPDFAnnotationObjectHelper(&local_200);
          local_368._0_8_ = local_2f0._8_8_;
          local_368._8_8_ = local_2f0._16_8_;
          if ((string *)local_2f0._16_8_ != (string *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)(local_2f0._16_8_ + 8) = *(int *)(local_2f0._16_8_ + 8) + 1;
              UNLOCK();
            }
            else {
              *(int *)(local_2f0._16_8_ + 8) = *(int *)(local_2f0._16_8_ + 8) + 1;
            }
          }
          bVar3 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)local_368);
          if ((string *)local_368._8_8_ != (string *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_368._8_8_);
          }
          if (bVar3) {
            JSON::makeDictionary();
            JSON::addArrayElement((JSON *)(local_328 + 0x10),&local_260);
            if ((string *)local_368._8_8_ != (string *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_368._8_8_);
            }
            local_368._0_8_ = local_368 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_368,"object","");
            local_328._0_8_ = local_2f0._8_8_;
            local_328._8_8_ = local_2f0._16_8_;
            if ((string *)local_2f0._16_8_ != (string *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)(local_2f0._16_8_ + 8) = *(int *)(local_2f0._16_8_ + 8) + 1;
                UNLOCK();
              }
              else {
                *(int *)(local_2f0._16_8_ + 8) = *(int *)(local_2f0._16_8_ + 8) + 1;
              }
            }
            QPDFObjectHandle::getJSON
                      ((QPDFObjectHandle *)&local_348,(int)local_328,
                       SUB41(((((shared_ptr<QPDFJob::Members> *)
                               &(local_2f8._M_pi)->_vptr__Sp_counted_base)->
                              super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr)->json_version,0));
            JSON::addDictionaryMember(&local_60,(string *)(local_328 + 0x10),(JSON *)local_368);
            if (local_60.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_60.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_348._M_string_length !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_348._M_string_length)
              ;
            }
            if ((string *)local_328._8_8_ != (string *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_328._8_8_);
            }
            if ((element_type *)local_368._0_8_ != (element_type *)(local_368 + 0x10)) {
              operator_delete((void *)local_368._0_8_,
                              (ulong)((long)&((_Alloc_hider *)local_368._16_8_)->_M_p + 1));
            }
            local_368._0_8_ = local_368 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_368,"parent","");
            local_308._M_allocated_capacity = local_2f0._8_8_;
            local_308._8_8_ = local_2f0._16_8_;
            if ((string *)local_2f0._16_8_ != (string *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)(local_2f0._16_8_ + 8) = *(int *)(local_2f0._16_8_ + 8) + 1;
                UNLOCK();
              }
              else {
                *(int *)(local_2f0._16_8_ + 8) = *(int *)(local_2f0._16_8_ + 8) + 1;
              }
            }
            local_348._M_dataplus._M_p = (pointer)((long)&local_348 + 0x10);
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"/Parent","");
            QPDFObjectHandle::getKey((QPDFObjectHandle *)local_2b8,(string *)&local_308);
            QPDFObjectHandle::getJSON
                      ((QPDFObjectHandle *)local_328,(int)(QPDFObjectHandle *)local_2b8,
                       SUB41(((((shared_ptr<QPDFJob::Members> *)
                               &(local_2f8._M_pi)->_vptr__Sp_counted_base)->
                              super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr)->json_version,0));
            JSON::addDictionaryMember(&local_70,(string *)(local_328 + 0x10),(JSON *)local_368);
            if (local_70.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_70.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if ((string *)local_328._8_8_ != (string *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_328._8_8_);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._8_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_348._M_dataplus._M_p !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((long)&local_348 + 0x10U)) {
              operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1
                             );
            }
            if ((string *)local_308._8_8_ != (string *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_308._8_8_);
            }
            if ((element_type *)local_368._0_8_ != (element_type *)(local_368 + 0x10)) {
              operator_delete((void *)local_368._0_8_,
                              (ulong)((long)&((_Alloc_hider *)local_368._16_8_)->_M_p + 1));
            }
            local_368._0_8_ = local_368 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_368,"pageposfrom1","");
            JSON::makeInt((JSON *)&local_348,local_298);
            JSON::addDictionaryMember(&local_80,(string *)(local_328 + 0x10),(JSON *)local_368);
            if (local_80.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_80.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_348._M_string_length !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_348._M_string_length)
              ;
            }
            if ((element_type *)local_368._0_8_ != (element_type *)(local_368 + 0x10)) {
              operator_delete((void *)local_368._0_8_,
                              (ulong)((long)&((_Alloc_hider *)local_368._16_8_)->_M_p + 1));
            }
            local_368._0_8_ = local_368 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_368,"fieldtype","");
            QPDFFormFieldObjectHelper::getFieldType_abi_cxx11_
                      (&local_348,(QPDFFormFieldObjectHelper *)local_2f0);
            JSON::makeString((JSON *)local_328,&local_348);
            JSON::addDictionaryMember(&local_90,(string *)(local_328 + 0x10),(JSON *)local_368);
            if (local_90.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_90.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if ((string *)local_328._8_8_ != (string *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_328._8_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_348._M_dataplus._M_p !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((long)&local_348 + 0x10U)) {
              operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1
                             );
            }
            if ((element_type *)local_368._0_8_ != (element_type *)(local_368 + 0x10)) {
              operator_delete((void *)local_368._0_8_,
                              (ulong)((long)&((_Alloc_hider *)local_368._16_8_)->_M_p + 1));
            }
            local_368._0_8_ = local_368 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_368,"fieldflags","");
            iVar4 = QPDFFormFieldObjectHelper::getFlags((QPDFFormFieldObjectHelper *)local_2f0);
            JSON::makeInt((JSON *)&local_348,(long)iVar4);
            JSON::addDictionaryMember(&local_a0,(string *)(local_328 + 0x10),(JSON *)local_368);
            if (local_a0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_a0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_348._M_string_length !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_348._M_string_length)
              ;
            }
            if ((element_type *)local_368._0_8_ != (element_type *)(local_368 + 0x10)) {
              operator_delete((void *)local_368._0_8_,
                              (ulong)((long)&((_Alloc_hider *)local_368._16_8_)->_M_p + 1));
            }
            local_368._0_8_ = local_368 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_368,"fullname","");
            QPDFFormFieldObjectHelper::getFullyQualifiedName_abi_cxx11_
                      (&local_348,(QPDFFormFieldObjectHelper *)local_2f0);
            JSON::makeString((JSON *)local_328,&local_348);
            JSON::addDictionaryMember(&local_b0,(string *)(local_328 + 0x10),(JSON *)local_368);
            if (local_b0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_b0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if ((string *)local_328._8_8_ != (string *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_328._8_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_348._M_dataplus._M_p !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((long)&local_348 + 0x10U)) {
              operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1
                             );
            }
            if ((element_type *)local_368._0_8_ != (element_type *)(local_368 + 0x10)) {
              operator_delete((void *)local_368._0_8_,
                              (ulong)((long)&((_Alloc_hider *)local_368._16_8_)->_M_p + 1));
            }
            local_368._0_8_ = local_368 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_368,"partialname","");
            QPDFFormFieldObjectHelper::getPartialName_abi_cxx11_
                      (&local_348,(QPDFFormFieldObjectHelper *)local_2f0);
            JSON::makeString((JSON *)local_328,&local_348);
            JSON::addDictionaryMember(&local_c0,(string *)(local_328 + 0x10),(JSON *)local_368);
            if (local_c0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_c0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if ((string *)local_328._8_8_ != (string *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_328._8_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_348._M_dataplus._M_p !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((long)&local_348 + 0x10U)) {
              operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1
                             );
            }
            if ((element_type *)local_368._0_8_ != (element_type *)(local_368 + 0x10)) {
              operator_delete((void *)local_368._0_8_,
                              (ulong)((long)&((_Alloc_hider *)local_368._16_8_)->_M_p + 1));
            }
            local_368._0_8_ = local_368 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_368,"alternativename","");
            QPDFFormFieldObjectHelper::getAlternativeName_abi_cxx11_
                      (&local_348,(QPDFFormFieldObjectHelper *)local_2f0);
            JSON::makeString((JSON *)local_328,&local_348);
            JSON::addDictionaryMember(&local_d0,(string *)(local_328 + 0x10),(JSON *)local_368);
            if (local_d0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_d0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if ((string *)local_328._8_8_ != (string *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_328._8_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_348._M_dataplus._M_p !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((long)&local_348 + 0x10U)) {
              operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1
                             );
            }
            if ((element_type *)local_368._0_8_ != (element_type *)(local_368 + 0x10)) {
              operator_delete((void *)local_368._0_8_,
                              (ulong)((long)&((_Alloc_hider *)local_368._16_8_)->_M_p + 1));
            }
            local_368._0_8_ = local_368 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_368,"mappingname","");
            QPDFFormFieldObjectHelper::getMappingName_abi_cxx11_
                      (&local_348,(QPDFFormFieldObjectHelper *)local_2f0);
            JSON::makeString((JSON *)local_328,&local_348);
            JSON::addDictionaryMember(&local_e0,(string *)(local_328 + 0x10),(JSON *)local_368);
            if (local_e0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_e0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if ((string *)local_328._8_8_ != (string *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_328._8_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_348._M_dataplus._M_p !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((long)&local_348 + 0x10U)) {
              operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1
                             );
            }
            if ((element_type *)local_368._0_8_ != (element_type *)(local_368 + 0x10)) {
              operator_delete((void *)local_368._0_8_,
                              (ulong)((long)&((_Alloc_hider *)local_368._16_8_)->_M_p + 1));
            }
            local_368._0_8_ = local_368 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_368,"value","");
            QPDFFormFieldObjectHelper::getValue((QPDFFormFieldObjectHelper *)local_328);
            QPDFObjectHandle::getJSON
                      ((QPDFObjectHandle *)&local_348,(int)(QPDFFormFieldObjectHelper *)local_328,
                       SUB41(((((shared_ptr<QPDFJob::Members> *)
                               &(local_2f8._M_pi)->_vptr__Sp_counted_base)->
                              super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr)->json_version,0));
            JSON::addDictionaryMember(&local_f0,(string *)(local_328 + 0x10),(JSON *)local_368);
            if (local_f0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_f0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_348._M_string_length !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_348._M_string_length)
              ;
            }
            if ((string *)local_328._8_8_ != (string *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_328._8_8_);
            }
            if ((element_type *)local_368._0_8_ != (element_type *)(local_368 + 0x10)) {
              operator_delete((void *)local_368._0_8_,
                              (ulong)((long)&((_Alloc_hider *)local_368._16_8_)->_M_p + 1));
            }
            local_368._0_8_ = local_368 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_368,"defaultvalue","");
            QPDFFormFieldObjectHelper::getDefaultValue((QPDFFormFieldObjectHelper *)local_328);
            QPDFObjectHandle::getJSON
                      ((QPDFObjectHandle *)&local_348,(int)(QPDFFormFieldObjectHelper *)local_328,
                       SUB41(((((shared_ptr<QPDFJob::Members> *)
                               &(local_2f8._M_pi)->_vptr__Sp_counted_base)->
                              super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr)->json_version,0));
            JSON::addDictionaryMember(&local_100,(string *)(local_328 + 0x10),(JSON *)local_368);
            if (local_100.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_100.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_348._M_string_length !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_348._M_string_length)
              ;
            }
            if ((string *)local_328._8_8_ != (string *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_328._8_8_);
            }
            if ((element_type *)local_368._0_8_ != (element_type *)(local_368 + 0x10)) {
              operator_delete((void *)local_368._0_8_,
                              (ulong)((long)&((_Alloc_hider *)local_368._16_8_)->_M_p + 1));
            }
            local_368._0_8_ = local_368 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_368,"quadding","");
            iVar4 = QPDFFormFieldObjectHelper::getQuadding((QPDFFormFieldObjectHelper *)local_2f0);
            JSON::makeInt((JSON *)&local_348,(long)iVar4);
            JSON::addDictionaryMember(&local_110,(string *)(local_328 + 0x10),(JSON *)local_368);
            if (local_110.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_110.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_348._M_string_length !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_348._M_string_length)
              ;
            }
            if ((element_type *)local_368._0_8_ != (element_type *)(local_368 + 0x10)) {
              operator_delete((void *)local_368._0_8_,
                              (ulong)((long)&((_Alloc_hider *)local_368._16_8_)->_M_p + 1));
            }
            local_368._0_8_ = local_368 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_368,"ischeckbox","");
            bVar3 = QPDFFormFieldObjectHelper::isCheckbox((QPDFFormFieldObjectHelper *)local_2f0);
            JSON::makeBool((JSON *)&local_348,bVar3);
            JSON::addDictionaryMember(&local_120,(string *)(local_328 + 0x10),(JSON *)local_368);
            if (local_120.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_120.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_348._M_string_length !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_348._M_string_length)
              ;
            }
            if ((element_type *)local_368._0_8_ != (element_type *)(local_368 + 0x10)) {
              operator_delete((void *)local_368._0_8_,
                              (ulong)((long)&((_Alloc_hider *)local_368._16_8_)->_M_p + 1));
            }
            local_368._0_8_ = local_368 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_368,"isradiobutton","");
            bVar3 = QPDFFormFieldObjectHelper::isRadioButton((QPDFFormFieldObjectHelper *)local_2f0)
            ;
            JSON::makeBool((JSON *)&local_348,bVar3);
            JSON::addDictionaryMember(&local_130,(string *)(local_328 + 0x10),(JSON *)local_368);
            if (local_130.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_130.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_348._M_string_length !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_348._M_string_length)
              ;
            }
            if ((element_type *)local_368._0_8_ != (element_type *)(local_368 + 0x10)) {
              operator_delete((void *)local_368._0_8_,
                              (ulong)((long)&((_Alloc_hider *)local_368._16_8_)->_M_p + 1));
            }
            local_368._0_8_ = local_368 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_368,"ischoice","");
            bVar3 = QPDFFormFieldObjectHelper::isChoice((QPDFFormFieldObjectHelper *)local_2f0);
            JSON::makeBool((JSON *)&local_348,bVar3);
            JSON::addDictionaryMember(&local_140,(string *)(local_328 + 0x10),(JSON *)local_368);
            if (local_140.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_140.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_348._M_string_length !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_348._M_string_length)
              ;
            }
            if ((element_type *)local_368._0_8_ != (element_type *)(local_368 + 0x10)) {
              operator_delete((void *)local_368._0_8_,
                              (ulong)((long)&((_Alloc_hider *)local_368._16_8_)->_M_p + 1));
            }
            local_368._0_8_ = local_368 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_368,"istext","");
            bVar3 = QPDFFormFieldObjectHelper::isText((QPDFFormFieldObjectHelper *)local_2f0);
            JSON::makeBool((JSON *)&local_348,bVar3);
            JSON::addDictionaryMember(&local_150,(string *)(local_328 + 0x10),(JSON *)local_368);
            if (local_150.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_150.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_348._M_string_length !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_348._M_string_length)
              ;
            }
            if ((element_type *)local_368._0_8_ != (element_type *)(local_368 + 0x10)) {
              operator_delete((void *)local_368._0_8_,
                              (ulong)((long)&((_Alloc_hider *)local_368._16_8_)->_M_p + 1));
            }
            local_368._0_8_ = local_368 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_368,"choices","");
            JSON::makeArray();
            JSON::addDictionaryMember
                      ((JSON *)local_328,(string *)(local_328 + 0x10),(JSON *)local_368);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_348._M_string_length !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_348._M_string_length)
              ;
            }
            if ((element_type *)local_368._0_8_ != (element_type *)(local_368 + 0x10)) {
              operator_delete((void *)local_368._0_8_,
                              (ulong)((long)&((_Alloc_hider *)local_368._16_8_)->_M_p + 1));
            }
            QPDFFormFieldObjectHelper::getChoices_abi_cxx11_
                      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_368,(QPDFFormFieldObjectHelper *)local_2f0);
            uVar2 = local_368._8_8_;
            for (utf8 = (element_type *)local_368._0_8_; utf8 != (element_type *)uVar2;
                utf8 = (element_type *)
                       ((long)&(utf8->value).
                               super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                               .
                               super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                               .
                               super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                               .
                               super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                               .
                               super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                               .
                               super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                       + 0x20)) {
              JSON::makeString((JSON *)&local_348,(string *)utf8);
              JSON::addArrayElement(&local_160,(JSON *)local_328);
              if (local_160.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_160.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_348._M_string_length !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_348._M_string_length);
              }
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_368);
            local_368._0_8_ = local_368 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_368,"annotation","");
            JSON::makeDictionary();
            JSON::addDictionaryMember
                      ((JSON *)local_2b8,(string *)(local_328 + 0x10),(JSON *)local_368);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_348._M_string_length !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_348._M_string_length)
              ;
            }
            if ((element_type *)local_368._0_8_ != (element_type *)(local_368 + 0x10)) {
              operator_delete((void *)local_368._0_8_,
                              (ulong)((long)&((_Alloc_hider *)local_368._16_8_)->_M_p + 1));
            }
            local_368._0_8_ = local_368 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_368,"object","");
            local_308._M_allocated_capacity =
                 (size_type)
                 (this_00->super_QPDFObjectHelper).super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            local_308._8_8_ =
                 (this_00->super_QPDFObjectHelper).super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_308._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_308._8_8_)->_M_use_count =
                     ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_308._8_8_)->_M_use_count
                     + 1;
                UNLOCK();
              }
              else {
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_308._8_8_)->_M_use_count =
                     ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_308._8_8_)->_M_use_count
                     + 1;
              }
            }
            QPDFObjectHandle::getJSON
                      ((QPDFObjectHandle *)&local_348,(int)&local_308,
                       SUB41(((((shared_ptr<QPDFJob::Members> *)
                               &(local_2f8._M_pi)->_vptr__Sp_counted_base)->
                              super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr)->json_version,0));
            JSON::addDictionaryMember(&local_170,(string *)local_2b8,(JSON *)local_368);
            if (local_170.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_170.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_348._M_string_length !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_348._M_string_length)
              ;
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_308._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_308._8_8_);
            }
            if ((element_type *)local_368._0_8_ != (element_type *)(local_368 + 0x10)) {
              operator_delete((void *)local_368._0_8_,
                              (ulong)((long)&((_Alloc_hider *)local_368._16_8_)->_M_p + 1));
            }
            local_368._0_8_ = local_368 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_368,"appearancestate","");
            QPDFAnnotationObjectHelper::getAppearanceState_abi_cxx11_(&local_348,this_00);
            JSON::makeString((JSON *)&local_308,&local_348);
            JSON::addDictionaryMember(&local_180,(string *)local_2b8,(JSON *)local_368);
            if (local_180.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_180.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_308._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_308._8_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_348._M_dataplus._M_p !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((long)&local_348 + 0x10U)) {
              operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1
                             );
            }
            if ((element_type *)local_368._0_8_ != (element_type *)(local_368 + 0x10)) {
              operator_delete((void *)local_368._0_8_,
                              (ulong)((long)&((_Alloc_hider *)local_368._16_8_)->_M_p + 1));
            }
            local_368._0_8_ = local_368 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_368,"annotationflags","");
            iVar4 = QPDFAnnotationObjectHelper::getFlags(this_00);
            JSON::makeInt((JSON *)&local_348,(long)iVar4);
            JSON::addDictionaryMember(&local_190,(string *)local_2b8,(JSON *)local_368);
            if (local_190.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_190.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_348._M_string_length !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_348._M_string_length)
              ;
            }
            if ((element_type *)local_368._0_8_ != (element_type *)(local_368 + 0x10)) {
              operator_delete((void *)local_368._0_8_,
                              (ulong)((long)&((_Alloc_hider *)local_368._16_8_)->_M_p + 1));
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._8_8_);
            }
            if ((string *)local_328._8_8_ != (string *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_328._8_8_);
            }
            if (local_310 != (element_type *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_310);
            }
          }
          QPDFFormFieldObjectHelper::~QPDFFormFieldObjectHelper
                    ((QPDFFormFieldObjectHelper *)local_2f0);
          this_00 = this_00 + 1;
        } while (this_00 != local_268);
      }
      std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>::~vector
                (&local_230);
      local_218.super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>.
      _M_impl.super__Vector_impl_data._M_start = local_270 + 1;
    } while (local_218.
             super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>._M_impl
             .super__Vector_impl_data._M_start != local_278);
  }
  std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector(&local_218);
  local_2f0._0_8_ = (element_type *)(local_2f0 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2f0,"acroform","");
  JSON::writeDictionaryItem(local_288,local_280,(string *)local_2f0,(JSON *)(local_2b8 + 0x10),1);
  if ((element_type *)local_2f0._0_8_ != (element_type *)(local_2f0 + 0x10)) {
    operator_delete((void *)local_2f0._0_8_,(ulong)(local_2f0._16_8_ + 1));
  }
  if (local_260.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_260.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  QPDFAcroFormDocumentHelper::~QPDFAcroFormDocumentHelper(&local_250);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._24_8_);
  }
  return;
}

Assistant:

void
QPDFJob::doJSONAcroform(Pipeline* p, bool& first, QPDF& pdf)
{
    JSON j_acroform = JSON::makeDictionary();
    QPDFAcroFormDocumentHelper afdh(pdf);
    j_acroform.addDictionaryMember("hasacroform", JSON::makeBool(afdh.hasAcroForm()));
    j_acroform.addDictionaryMember("needappearances", JSON::makeBool(afdh.getNeedAppearances()));
    JSON j_fields = j_acroform.addDictionaryMember("fields", JSON::makeArray());
    int pagepos1 = 0;
    for (auto const& page: QPDFPageDocumentHelper(pdf).getAllPages()) {
        ++pagepos1;
        for (auto& aoh: afdh.getWidgetAnnotationsForPage(page)) {
            QPDFFormFieldObjectHelper ffh = afdh.getFieldForAnnotation(aoh);
            if (!ffh.getObjectHandle().isDictionary()) {
                continue;
            }
            JSON j_field = j_fields.addArrayElement(JSON::makeDictionary());
            j_field.addDictionaryMember("object", ffh.getObjectHandle().getJSON(m->json_version));
            j_field.addDictionaryMember(
                "parent", ffh.getObjectHandle().getKey("/Parent").getJSON(m->json_version));
            j_field.addDictionaryMember("pageposfrom1", JSON::makeInt(pagepos1));
            j_field.addDictionaryMember("fieldtype", JSON::makeString(ffh.getFieldType()));
            j_field.addDictionaryMember("fieldflags", JSON::makeInt(ffh.getFlags()));
            j_field.addDictionaryMember("fullname", JSON::makeString(ffh.getFullyQualifiedName()));
            j_field.addDictionaryMember("partialname", JSON::makeString(ffh.getPartialName()));
            j_field.addDictionaryMember(
                "alternativename", JSON::makeString(ffh.getAlternativeName()));
            j_field.addDictionaryMember("mappingname", JSON::makeString(ffh.getMappingName()));
            j_field.addDictionaryMember("value", ffh.getValue().getJSON(m->json_version));
            j_field.addDictionaryMember(
                "defaultvalue", ffh.getDefaultValue().getJSON(m->json_version));
            j_field.addDictionaryMember("quadding", JSON::makeInt(ffh.getQuadding()));
            j_field.addDictionaryMember("ischeckbox", JSON::makeBool(ffh.isCheckbox()));
            j_field.addDictionaryMember("isradiobutton", JSON::makeBool(ffh.isRadioButton()));
            j_field.addDictionaryMember("ischoice", JSON::makeBool(ffh.isChoice()));
            j_field.addDictionaryMember("istext", JSON::makeBool(ffh.isText()));
            JSON j_choices = j_field.addDictionaryMember("choices", JSON::makeArray());
            for (auto const& choice: ffh.getChoices()) {
                j_choices.addArrayElement(JSON::makeString(choice));
            }
            JSON j_annot = j_field.addDictionaryMember("annotation", JSON::makeDictionary());
            j_annot.addDictionaryMember("object", aoh.getObjectHandle().getJSON(m->json_version));
            j_annot.addDictionaryMember(
                "appearancestate", JSON::makeString(aoh.getAppearanceState()));
            j_annot.addDictionaryMember("annotationflags", JSON::makeInt(aoh.getFlags()));
        }
    }
    JSON::writeDictionaryItem(p, first, "acroform", j_acroform, 1);
}